

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

void __thiscall
Assimp::FBXExporter::WriteAnimationCurveNode
          (FBXExporter *this,StreamWriterLE *outstream,int64_t uid,string *name,
          aiVector3D default_value,string *property_name,int64_t layer_uid,int64_t node_uid)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int64_t value;
  long *plVar3;
  size_type *psVar4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Node p;
  Node n;
  string local_180;
  int64_t local_160;
  float local_154;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  int64_t local_130;
  Node local_128;
  undefined1 local_b8 [24];
  Node local_a0;
  
  local_154 = default_value.z;
  local_b8._8_4_ = in_XMM0_Dc;
  local_b8._0_8_ = default_value._0_8_;
  local_b8._12_4_ = in_XMM0_Dd;
  paVar1 = &local_128.name.field_2;
  local_160 = uid;
  local_130 = layer_uid;
  local_128.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"AnimationCurveNode","");
  local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_128.name._M_dataplus._M_p,
             local_128.name._M_dataplus._M_p + local_128.name._M_string_length);
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.force_has_children = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_128.name._M_dataplus._M_p,local_128.name.field_2._M_allocated_capacity + 1
                   );
  }
  value = local_160;
  std::operator+(&local_128.name,name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &FBX::SEPARATOR_abi_cxx11_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_128);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_150.field_2._M_allocated_capacity = *psVar4;
    local_150.field_2._8_8_ = plVar3[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar4;
    local_150._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_150._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>(&local_a0,value,&local_150,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_128.name._M_dataplus._M_p,local_128.name.field_2._M_allocated_capacity + 1
                   );
  }
  paVar2 = &local_180.field_2;
  local_180._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"Properties70","");
  local_128.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  local_128.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.force_has_children = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"d|X","");
  FBX::Node::AddP70numberA(&local_128,&local_180,(double)(float)local_b8._0_4_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"d|Y","");
  FBX::Node::AddP70numberA(&local_128,&local_180,(double)(float)local_b8._4_4_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"d|Z","");
  FBX::Node::AddP70numberA(&local_128,&local_180,(double)local_154);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&local_a0.children,&local_128);
  FBX::Node::Dump(&local_a0,outstream,this->binary,1);
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0x6d3a01,(char (*) [3])"OO",&local_160,&local_130);
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&,std::__cxx11::string&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0x6d3a01,(char (*) [3])"OP",&local_160,&node_uid,property_name);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_128.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_128.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_128.name._M_dataplus._M_p,local_128.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_a0.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_a0.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p,local_a0.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBXExporter::WriteAnimationCurveNode(
    StreamWriterLE& outstream,
    int64_t uid,
    const std::string& name, // "T", "R", or "S"
    aiVector3D default_value,
    std::string property_name, // "Lcl Translation" etc
    int64_t layer_uid,
    int64_t node_uid
) {
    FBX::Node n("AnimationCurveNode");
    n.AddProperties(uid, name + FBX::SEPARATOR + "AnimCurveNode", "");
    FBX::Node p("Properties70");
    p.AddP70numberA("d|X", default_value.x);
    p.AddP70numberA("d|Y", default_value.y);
    p.AddP70numberA("d|Z", default_value.z);
    n.AddChild(p);
    n.Dump(outstream, binary, 1);
    // connect to layer
    this->connections.emplace_back("C", "OO", uid, layer_uid);
    // connect to bone
    this->connections.emplace_back("C", "OP", uid, node_uid, property_name);
}